

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

Node * __thiscall
wasm::DataFlow::Graph::makeZeroComp(Graph *this,Node *node,bool equal,Expression *origin)

{
  Module *pMVar1;
  BinaryOp BVar2;
  Type type;
  Node *node_00;
  Expression *pEVar3;
  Expression *pEVar4;
  Binary *this_00;
  Node *pNVar5;
  Graph *this_01;
  
  if (node->type != Bad) {
    pMVar1 = this->module;
    type = Node::getWasmType(node);
    this_01 = this;
    if (1 < type.id) {
      node_00 = makeZero(this,type);
      BVar2 = Abstract::getBinary(type,equal ^ Ne);
      pEVar3 = makeUse(this,node);
      pEVar4 = makeUse(this,node_00);
      this_00 = (Binary *)MixedArena::allocSpace(&pMVar1->allocator,0x28,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      this_00->op = BVar2;
      this_00->left = pEVar3;
      this_00->right = pEVar4;
      Binary::finalize(this_00);
      pNVar5 = (Node *)operator_new(0x30);
      pNVar5->type = Expr;
      (pNVar5->values).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pNVar5->values).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pNVar5->values).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pNVar5->field_1).expr = (Expression *)this_00;
      pNVar5->origin = origin;
      this_01 = (Graph *)addNode(this,pNVar5);
      pNVar5 = expandFromI1(this,node,origin);
      Node::addValue((Node *)this_01,pNVar5);
      Node::addValue((Node *)this_01,node_00);
    }
    return &this_01->bad;
  }
  __assert_fail("!node->isBad()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                ,0xa7,"Node *wasm::DataFlow::Graph::makeZeroComp(Node *, bool, Expression *)");
}

Assistant:

Node* makeZeroComp(Node* node, bool equal, Expression* origin) {
    assert(!node->isBad());
    Builder builder(*module);
    auto type = node->getWasmType();
    if (!type.isConcrete()) {
      return &bad;
    }
    auto* zero = makeZero(type);
    auto* expr = builder.makeBinary(
      Abstract::getBinary(type, equal ? Abstract::Eq : Abstract::Ne),
      makeUse(node),
      makeUse(zero));
    auto* check = addNode(Node::makeExpr(expr, origin));
    check->addValue(expandFromI1(node, origin));
    check->addValue(zero);
    return check;
  }